

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

void __thiscall
glcts::LayoutBindingBaseCase::LayoutBindingBaseCase
          (LayoutBindingBaseCase *this,Context *context,char *name,char *description,StageType stage
          ,LayoutBindingParameters *samplerType,GLSLVersion glslVersion)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  eSurfaceType eVar5;
  eTextureType eVar6;
  char *description_local;
  char *name_local;
  Context *context_local;
  LayoutBindingBaseCase *this_local;
  StageType stage_local;
  
  deqp::TestCase::TestCase(&this->super_TestCase,context,name,description);
  IProgramContextSupplier::IProgramContextSupplier(&this->super_IProgramContextSupplier);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__LayoutBindingBaseCase_0324b3e0;
  (this->super_IProgramContextSupplier)._vptr_IProgramContextSupplier = (_func_int **)&DAT_0324b538;
  *(undefined8 *)&this->field_0x88 = 0;
  this->m_drawTest = 0;
  std::
  vector<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>
  ::vector(&this->m_tests);
  pcVar1 = samplerType->keyword;
  eVar5 = samplerType->surface_type;
  eVar6 = samplerType->texture_type;
  pcVar2 = samplerType->vector_type;
  pcVar3 = samplerType->uniform_type;
  pcVar4 = samplerType->access_function;
  (this->m_testParams).coord_vector_type = samplerType->coord_vector_type;
  (this->m_testParams).access_function = pcVar4;
  (this->m_testParams).vector_type = pcVar2;
  (this->m_testParams).uniform_type = pcVar3;
  (this->m_testParams).keyword = pcVar1;
  (this->m_testParams).surface_type = eVar5;
  (this->m_testParams).texture_type = eVar6;
  (this->m_stage).name = stage.name;
  *(ulong *)&(this->m_stage).type = CONCAT44(stage_local.name._4_4_,stage.type);
  std::
  map<glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->m_sources);
  std::
  map<glcts::eStageType,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::map(&this->m_templateParams);
  std::
  map<glcts::eStageType,_const_char_*,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_const_char_*>_>_>
  ::map(&this->m_templates);
  std::
  map<int,_glu::Texture2D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2D_*>_>_>
  ::map(&this->m_textures2D);
  std::
  map<int,_glu::Texture2DArray_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2DArray_*>_>_>
  ::map(&this->m_textures2DArray);
  std::
  map<int,_glu::Texture3D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture3D_*>_>_>
  ::map(&this->m_textures3D);
  tcu::Vector<float,_4>::Vector(&this->m_expectedColor);
  this->m_uniformDeclTemplate = (char *)0x0;
  this->m_glslVersion = glslVersion;
  return;
}

Assistant:

LayoutBindingBaseCase::LayoutBindingBaseCase(Context& context, const char* name, const char* description,
											 StageType stage, LayoutBindingParameters& samplerType,
											 glu::GLSLVersion glslVersion)
	: TestCase(context, name, description)
	, m_drawTest(DE_NULL)
	, m_testParams(samplerType)
	, m_stage(stage)
	, m_uniformDeclTemplate(DE_NULL)
	, m_glslVersion(glslVersion)
{
}